

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O1

image * load_png_image_from_file(FILE *fp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  __jmp_buf_tag *__env;
  image *piVar10;
  void *pvVar11;
  image *piVar12;
  size_t sVar13;
  FILE *__stream;
  undefined7 extraout_var;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  byte *pbVar17;
  char *__filename;
  byte *pbVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  size_t sVar22;
  byte *pbVar23;
  char *__size;
  png_structp png_ptr;
  png_infop info_ptr;
  char sig [8];
  long local_68;
  long local_60;
  size_t local_58;
  void *local_50;
  ulong local_48;
  image *local_40;
  undefined1 local_38 [8];
  
  fread(local_38,1,8,(FILE *)fp);
  iVar7 = png_sig_cmp(local_38,0,8);
  if (iVar7 != 0) {
    return (image *)0x0;
  }
  local_68 = png_create_read_struct("1.6.37",0,0,0);
  if (local_68 == 0) {
    return (image *)0x0;
  }
  local_60 = png_create_info_struct(local_68);
  if (local_60 == 0) {
    plVar16 = (long *)0x0;
LAB_00107ae0:
    png_destroy_read_struct(&local_68,plVar16,0);
    return (image *)0x0;
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_68,longjmp,200);
  iVar7 = _setjmp(__env);
  if (iVar7 != 0) {
    plVar16 = &local_60;
    goto LAB_00107ae0;
  }
  png_set_sig_bytes(local_68,8);
  png_init_io(local_68,fp);
  png_read_info(local_68,local_60);
  uVar8 = png_get_image_width(local_68,local_60);
  uVar9 = png_get_image_height(local_68,local_60);
  bVar4 = png_get_color_type(local_68,local_60);
  cVar5 = png_get_bit_depth(local_68,local_60);
  if (bVar4 == 3) {
    png_set_palette_to_rgb(local_68);
  }
  else if ((bVar4 & 0xfb) == 0) {
    png_set_gray_to_rgb(local_68);
  }
  uVar19 = (ulong)uVar9;
  if (cVar5 == '\x10') {
    png_set_strip_16(local_68);
  }
  iVar7 = png_get_valid(local_68,local_60,0x10);
  if (iVar7 == 0) {
    bVar4 = bVar4 >> 2;
  }
  else {
    png_set_tRNS_to_alpha(local_68);
    bVar4 = 1;
  }
  if (uVar19 == 0) {
LAB_00107bd4:
    piVar10 = (image *)0x0;
  }
  else {
    piVar10 = (image *)malloc(uVar19 * 8);
    if (piVar10 == (image *)0x0) {
      load_png_image_from_file_cold_1();
      goto LAB_00107bd4;
    }
  }
  local_58 = (size_t)uVar8;
  sVar22 = (ulong)(bVar4 & 1) + 3;
  lVar15 = sVar22 * local_58;
  if (lVar15 * uVar19 != 0) {
    local_50 = malloc(lVar15 * uVar19);
    if (local_50 != (void *)0x0) goto LAB_00107c1b;
    load_png_image_from_file_cold_2();
  }
  local_50 = (void *)0x0;
LAB_00107c1b:
  if (uVar19 != 0) {
    uVar14 = 0;
    pvVar11 = local_50;
    do {
      (&piVar10->width)[uVar14] = (size_t)pvVar11;
      uVar14 = uVar14 + 1;
      pvVar11 = (void *)((long)pvVar11 + lVar15);
    } while (uVar19 != uVar14);
  }
  local_40 = piVar10;
  png_read_image(local_68);
  __filename = (char *)(sVar22 * 8 + 0x18);
  piVar12 = (image *)malloc((size_t)__filename);
  if (piVar12 != (image *)0x0) {
    piVar12->width = local_58;
    piVar12->height = uVar19;
    piVar12->channel_count = sVar22;
    __size = (char *)(local_58 * uVar19 * 4);
    sVar13 = 0;
    local_48 = uVar19;
    do {
      if (__size == (char *)0x0) {
        pvVar11 = (void *)0x0;
      }
      else {
        __filename = __size;
        pvVar11 = malloc((size_t)__size);
        if (pvVar11 == (void *)0x0) {
          load_png_image_from_file_cold_3();
          break;
        }
      }
      (&piVar12[1].width)[sVar13] = (size_t)pvVar11;
      sVar13 = sVar13 + 1;
      if (sVar22 == sVar13) {
        if (local_48 != 0) {
          pbVar18 = (byte *)((long)local_50 + 3);
          pbVar17 = (byte *)((long)local_50 + 2);
          uVar14 = 0;
          uVar19 = uVar14;
          do {
            if ((bVar4 & 1) == 0) {
              if (local_58 != 0) {
                sVar22 = piVar12->width;
                lVar20 = sVar22 * uVar14;
                lVar21 = 0;
                pbVar23 = pbVar18;
                do {
                  if (((-lVar21 == sVar22) || (piVar12->height <= uVar19)) || ((bVar4 & 1) == 0))
                  goto LAB_00107ece;
                  bVar1 = pbVar23[-2];
                  bVar2 = pbVar23[-1];
                  bVar3 = *pbVar23;
                  *(float *)(piVar12[1].width + lVar20) = (float)pbVar23[-3] * 0.003921569;
                  *(float *)(piVar12[1].height + lVar20) = (float)bVar1 * 0.003921569;
                  *(float *)(piVar12[1].channel_count + lVar20) = (float)bVar2 * 0.003921569;
                  *(float *)(piVar12[2].width + lVar20) = (float)bVar3 * 0.003921569;
                  lVar21 = lVar21 + -1;
                  pbVar23 = pbVar23 + 4;
                  lVar20 = lVar20 + 4;
                } while (-lVar21 != local_58);
              }
            }
            else if ((int)local_58 != 0) {
              sVar22 = piVar12->width;
              lVar20 = sVar22 * uVar14;
              lVar21 = 0;
              pbVar23 = pbVar17;
              do {
                if (((-lVar21 == sVar22) || (piVar12->height <= uVar19)) || ((bVar4 & 1) == 0)) {
LAB_00107ece:
                  __assert_fail("x < image->width && y < image->height && image->channel_count >= 4"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/image.h"
                                ,0x58,
                                "void set_rgba_pixel(struct image *, size_t, size_t, const struct rgba *)"
                               );
                }
                bVar1 = pbVar23[-1];
                bVar2 = *pbVar23;
                *(float *)(piVar12[1].width + lVar20) = (float)pbVar23[-2] * 0.003921569;
                *(float *)(piVar12[1].height + lVar20) = (float)bVar1 * 0.003921569;
                *(float *)(piVar12[1].channel_count + lVar20) = (float)bVar2 * 0.003921569;
                *(undefined4 *)(piVar12[2].width + lVar20) = 0;
                lVar21 = lVar21 + -1;
                pbVar23 = pbVar23 + 3;
                lVar20 = lVar20 + 4;
              } while (-lVar21 != local_58);
            }
            uVar19 = uVar19 + 1;
            pbVar18 = pbVar18 + lVar15;
            uVar14 = uVar14 + 4;
            pbVar17 = pbVar17 + lVar15;
          } while (uVar19 != local_48);
        }
        free(local_40);
        free(local_50);
        png_destroy_read_struct(&local_68,&local_60,0);
        return piVar12;
      }
    } while( true );
  }
  load_png_image_from_file_cold_4();
  if ((piVar10->channel_count - 3 < 2) &&
     (__stream = fopen(__filename,"wb"), __stream != (FILE *)0x0)) {
    _Var6 = save_png_image_to_file((FILE *)__stream,piVar10);
    piVar10 = (image *)(CONCAT71(extraout_var,_Var6) & 0xffffffff);
    fclose(__stream);
  }
  else {
    piVar10 = (image *)0x0;
  }
  return piVar10;
}

Assistant:

static struct image* load_png_image_from_file(FILE* fp) {
    char sig[8];
    fread(sig, 1, 8, fp);
    if (!png_check_sig((unsigned char*)sig, 8))
        return NULL;

    png_structp png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return NULL;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return NULL;
    }

    struct image* image = NULL;
    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (image)     free_image(image);
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
        return NULL;
    }

    png_set_sig_bytes(png_ptr, 8);
    png_init_io(png_ptr, fp);
    png_read_info(png_ptr, info_ptr);

    size_t width  = png_get_image_width(png_ptr, info_ptr);
    size_t height = png_get_image_height(png_ptr, info_ptr);

    png_uint_32 color_type = png_get_color_type(png_ptr, info_ptr);
    png_uint_32 bit_depth  = png_get_bit_depth(png_ptr, info_ptr);

    // Expand paletted and grayscale images to RGB
    if (color_type == PNG_COLOR_TYPE_PALETTE)
        png_set_palette_to_rgb(png_ptr);
    else if (
        color_type == PNG_COLOR_TYPE_GRAY ||
        color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
        png_set_gray_to_rgb(png_ptr);

    // Transform to 8 bit per channel
    if (bit_depth == 16)
        png_set_strip_16(png_ptr);

    // Get alpha channel when there is one
    bool has_alpha = color_type & PNG_COLOR_MASK_ALPHA;
    if (png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
        png_set_tRNS_to_alpha(png_ptr);
        has_alpha = true;
    }

    size_t channel_count = has_alpha ? 4 : 3;
    size_t stride = width * channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * height);
    for (size_t i = 0; i < height; ++i)
        row_ptrs[i] = row_bytes + stride * i;
    png_read_image(png_ptr, row_ptrs);

    // Transform the byte data into a floating point image
    image = new_image(width, height, channel_count);
    for (size_t i = 0; i < height; ++i) {
        const png_byte* row = row_bytes + stride * i;
        const real_t scale = (real_t)1 / (real_t)255;
        if (has_alpha) {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 3 + 0] * scale,
                    .g = (real_t)row[j * 3 + 1] * scale,
                    .b = (real_t)row[j * 3 + 2] * scale,
                });
            }
        } else {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 4 + 0] * scale,
                    .g = (real_t)row[j * 4 + 1] * scale,
                    .b = (real_t)row[j * 4 + 2] * scale,
                    .a = (real_t)row[j * 4 + 3] * scale
                });
            }
        }
    }
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
    return image;
}